

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

timespec __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::MakeClockAbsoluteTimespec
          (KernelTimeout *this,clockid_t c)

{
  timespec tVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int64_t iVar5;
  timespec tVar6;
  Duration DVar7;
  Duration DVar8;
  Duration from_clock_epoch;
  char *absl_raw_log_internal_basename;
  timespec now;
  int64_t nanos;
  clockid_t c_local;
  KernelTimeout *this_local;
  
  bVar2 = has_timeout(this);
  if (bVar2) {
    now.tv_nsec = RawAbsNanos(this);
    bVar2 = is_absolute_timeout(this);
    if (bVar2) {
      lVar4 = absl::lts_20240722::GetCurrentTimeNanos();
      now.tv_nsec = now.tv_nsec - lVar4;
    }
    else {
      iVar5 = SteadyClockNow();
      now.tv_nsec = now.tv_nsec - iVar5;
    }
    iVar3 = clock_gettime(c,(timespec *)&absl_raw_log_internal_basename);
    if (iVar3 != 0) {
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"kernel_timeout.cc",0xa5,"Check %s failed: %s","clock_gettime(c, &now) == 0"
                 ,"clock_gettime() failed");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/synchronization/internal/kernel_timeout.cc"
                    ,0xa5,
                    "struct timespec absl::synchronization_internal::KernelTimeout::MakeClockAbsoluteTimespec(clockid_t) const"
                   );
    }
    tVar1.tv_nsec = now.tv_sec;
    tVar1.tv_sec = (__time_t)absl_raw_log_internal_basename;
    DVar7 = (Duration)absl::lts_20240722::DurationFromTimespec(tVar1);
    DVar8 = Nanoseconds<long,_0>(now.tv_nsec);
    DVar7 = operator+(DVar7,DVar8);
    DVar8 = ZeroDuration();
    bVar2 = operator<=(DVar7,DVar8);
    if (bVar2) {
      DVar7 = Nanoseconds<int,_0>(1);
      tVar6 = (timespec)absl::lts_20240722::ToTimespec(DVar7);
    }
    else {
      tVar6 = (timespec)absl::lts_20240722::ToTimespec(DVar7);
    }
  }
  else {
    DVar7 = Nanoseconds<long,_0>(0x7fffffffffffffff);
    tVar6 = (timespec)absl::lts_20240722::ToTimespec(DVar7);
  }
  return tVar6;
}

Assistant:

struct timespec KernelTimeout::MakeClockAbsoluteTimespec(clockid_t c) const {
  if (!has_timeout()) {
    return absl::ToTimespec(absl::Nanoseconds(kMaxNanos));
  }

  int64_t nanos = RawAbsNanos();
  if (is_absolute_timeout()) {
    nanos -= absl::GetCurrentTimeNanos();
  } else {
    nanos -= SteadyClockNow();
  }

  struct timespec now;
  ABSL_RAW_CHECK(clock_gettime(c, &now) == 0, "clock_gettime() failed");
  absl::Duration from_clock_epoch =
      absl::DurationFromTimespec(now) + absl::Nanoseconds(nanos);
  if (from_clock_epoch <= absl::ZeroDuration()) {
    // Some callers have assumed that 0 means no timeout, so instead we return a
    // time of 1 nanosecond after the epoch. For safety we also do not return
    // negative values.
    return absl::ToTimespec(absl::Nanoseconds(1));
  }
  return absl::ToTimespec(from_clock_epoch);
}